

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaFreeType(xmlSchemaTypePtr type)

{
  _xmlSchemaFacet *p_Var1;
  _xmlSchemaFacetLink *p_Var2;
  xmlSchemaFacetLinkPtr local_30;
  xmlSchemaFacetLinkPtr link;
  xmlSchemaFacetLinkPtr next_1;
  xmlSchemaFacetPtr next;
  xmlSchemaFacetPtr facet;
  xmlSchemaTypePtr type_local;
  
  if (type != (xmlSchemaTypePtr)0x0) {
    if (type->annot != (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaFreeAnnot(type->annot);
    }
    if (type->facets != (xmlSchemaFacetPtr)0x0) {
      next = type->facets;
      while (next != (xmlSchemaFacetPtr)0x0) {
        p_Var1 = next->next;
        xmlSchemaFreeFacet(next);
        next = p_Var1;
      }
    }
    if (type->attrUses != (void *)0x0) {
      xmlSchemaItemListFree((xmlSchemaItemListPtr)type->attrUses);
    }
    if (type->memberTypes != (xmlSchemaTypeLinkPtr)0x0) {
      xmlSchemaFreeTypeLinkList(type->memberTypes);
    }
    if (type->facetSet != (xmlSchemaFacetLinkPtr)0x0) {
      local_30 = type->facetSet;
      do {
        p_Var2 = local_30->next;
        (*xmlFree)(local_30);
        local_30 = p_Var2;
      } while (p_Var2 != (_xmlSchemaFacetLink *)0x0);
    }
    if (type->contModel != (xmlRegexpPtr)0x0) {
      xmlRegFreeRegexp(type->contModel);
    }
    (*xmlFree)(type);
  }
  return;
}

Assistant:

void
xmlSchemaFreeType(xmlSchemaTypePtr type)
{
    if (type == NULL)
        return;
    if (type->annot != NULL)
        xmlSchemaFreeAnnot(type->annot);
    if (type->facets != NULL) {
        xmlSchemaFacetPtr facet, next;

        facet = type->facets;
        while (facet != NULL) {
            next = facet->next;
            xmlSchemaFreeFacet(facet);
            facet = next;
        }
    }
    if (type->attrUses != NULL)
	xmlSchemaItemListFree((xmlSchemaItemListPtr) type->attrUses);
    if (type->memberTypes != NULL)
	xmlSchemaFreeTypeLinkList(type->memberTypes);
    if (type->facetSet != NULL) {
	xmlSchemaFacetLinkPtr next, link;

	link = type->facetSet;
	do {
	    next = link->next;
	    xmlFree(link);
	    link = next;
	} while (link != NULL);
    }
    if (type->contModel != NULL)
        xmlRegFreeRegexp(type->contModel);
    xmlFree(type);
}